

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O2

vector sptk::swipe::pitch(matrix S,vector pc,double st)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar7;
  double *extraout_RDX;
  uint uVar8;
  ulong uVar9;
  double **ppdVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  vector coefs;
  vector B;
  vector vVar22;
  vector vVar23;
  vector vVar24;
  vector vVar25;
  vector yr_vector;
  vector yr_vector_00;
  double *pdVar6;
  double *extraout_RDX_00;
  
  pdVar3 = pc.v;
  ppdVar10 = S.m;
  dVar16 = log2(pdVar3[2]);
  dVar17 = log2(*pdVar3);
  dVar16 = (dVar16 - dVar17) / 0.0013028 + 1.0;
  dVar16 = floor(dVar16 + *(double *)(&DAT_001261a0 + (ulong)(dVar16 < 0.0) * 8));
  uVar12 = (uint)dVar16;
  dVar16 = pdVar3[1];
  vVar22 = makev(3);
  pdVar4 = vVar22.v;
  vVar23 = makev(3);
  pdVar5 = vVar23.v;
  auVar20._8_8_ = dVar16;
  auVar20._0_8_ = *pdVar3;
  auVar20 = divpd(_DAT_001261b0,auVar20);
  dVar17 = auVar20._8_8_;
  auVar1._8_8_ = dVar17;
  auVar1._0_8_ = dVar17;
  auVar20 = divpd(auVar20,auVar1);
  dVar16 = auVar20._0_8_ + -1.0;
  dVar21 = auVar20._8_8_ + -1.0;
  *pdVar5 = (dVar16 + dVar16) * 3.141592653589793;
  pdVar5[1] = (dVar21 + dVar21) * 3.141592653589793;
  dVar16 = (1.0 / pdVar3[2]) / dVar17 + -1.0;
  pdVar5[2] = (dVar16 + dVar16) * 3.141592653589793;
  vVar24 = makev(S.y);
  uVar8 = S.x;
  yr_vector_00.v._0_4_ = uVar8 - 1;
  uVar15 = 0;
  uVar9 = 0;
  if (0 < (int)uVar8) {
    uVar9 = (ulong)uVar8;
  }
  if ((int)uVar12 < 1) {
    uVar12 = 0;
  }
  uVar11 = S._0_8_ >> 0x20;
  if (S.y == 0 || (long)S._0_8_ < 0) {
    uVar11 = uVar15;
  }
  uVar14 = 0xffffffffffffffff;
  for (; uVar15 != uVar11; uVar15 = uVar15 + 1) {
    dVar16 = -32768.0;
    for (uVar2 = 0; uVar9 != uVar2; uVar2 = uVar2 + 1) {
      dVar17 = ppdVar10[uVar2][uVar15];
      if (dVar16 < dVar17) {
        uVar14 = uVar2;
      }
      uVar14 = uVar14 & 0xffffffff;
      if (dVar17 <= dVar16) {
        dVar17 = dVar16;
      }
      dVar16 = dVar17;
    }
    dVar17 = 0.0;
    if (st < dVar16) {
      iVar13 = (int)uVar14;
      if (iVar13 == (int)yr_vector_00.v || iVar13 == 0) {
        dVar17 = *pdVar3;
      }
      else {
        dVar16 = pdVar3[iVar13];
        dVar21 = log2(pdVar3[(long)iVar13 + -1]);
        *pdVar4 = ppdVar10[(long)iVar13 + -1][uVar15];
        pdVar4[1] = ppdVar10[iVar13][uVar15];
        pdVar4[2] = ppdVar10[(long)iVar13 + 1][uVar15];
        vVar25._4_4_ = 0;
        vVar25.x = vVar23.x;
        B._4_4_ = 0;
        B.x = vVar22.x;
        vVar25.v = pdVar5;
        B.v = pdVar4;
        vVar25 = polyfit(vVar25,B,2);
        pdVar6 = vVar25.v;
        dVar19 = 0.0;
        dVar17 = -32768.0;
        pdVar7 = pdVar6;
        for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
          dVar18 = exp2(dVar19 * 0.0013028 + dVar21);
          dVar18 = (1.0 / dVar18) / (1.0 / dVar16) + -1.0;
          coefs._4_4_ = 0;
          coefs.x = vVar25.x;
          coefs.v = pdVar6;
          dVar18 = polyval(coefs,(dVar18 + dVar18) * 3.141592653589793);
          uVar14 = uVar14 & 0xffffffff;
          if (dVar17 < dVar18) {
            uVar14 = (ulong)uVar8;
            dVar17 = dVar18;
          }
          dVar19 = dVar19 + 1.0;
          pdVar7 = extraout_RDX;
        }
        yr_vector.v = pdVar7;
        yr_vector._0_8_ = pdVar6;
        freev((swipe *)(ulong)(uint)vVar25.x,yr_vector);
        dVar17 = exp2((double)(int)uVar14 * 0.0013028 + dVar21);
      }
    }
    vVar24.v[uVar15] = dVar17;
  }
  yr_vector_00._0_8_ = pdVar5;
  yr_vector_00.v._4_4_ = 0;
  freev((swipe *)(ulong)(uint)vVar23.x,yr_vector_00);
  vVar23.v = extraout_RDX_00;
  vVar23._0_8_ = pdVar4;
  freev((swipe *)(ulong)(uint)vVar22.x,vVar23);
  vVar24._4_4_ = 0;
  return vVar24;
}

Assistant:

vector pitch(matrix S, vector pc, double st) {
    int i, j;
    int maxi = -1;
    int search = (int) round((log2(pc.v[2]) - log2(pc.v[0])) / POLYV + 1.);
    double nftc, maxv, log2pc;
    double tc2 = 1. / pc.v[1];
    vector coefs;
    vector s = makev(3);
    vector ntc = makev(3);
    ntc.v[0] = ((1. / pc.v[0]) / tc2 - 1.) * 2. * M_PI; 
    ntc.v[1] = (tc2 / tc2 - 1.) * 2. * M_PI; 
    ntc.v[2] = ((1. / pc.v[2]) / tc2 - 1.) * 2. * M_PI;
    vector p = makev(S.y);  
    for (j = 0; j < S.y; j++) {
        maxv = SHRT_MIN;  
        for (i = 0; i < S.x; i++) {
            if (S.m[i][j] > maxv) {
                maxv = S.m[i][j];
                maxi = i;
            }
        }
        if (maxv > st) { // make sure it's big enough
            if (maxi == 0 || maxi == S.x - 1) p.v[j] = pc.v[0];
            else { // general case
                tc2 = 1. / pc.v[maxi];
                log2pc = log2(pc.v[maxi - 1]); 
                s.v[0] = S.m[maxi - 1][j];
                s.v[1] = S.m[maxi][j];
                s.v[2] = S.m[maxi + 1][j]; 
                coefs = polyfit(ntc, s, 2); 
                maxv = SHRT_MIN; 
                for (i = 0; i < search; i++) { // check the nftc space
                    nftc = polyval(coefs, ((1. / pow(2, i * POLYV + 
                                   log2pc)) / tc2 - 1) * 2 * M_PI);
                    if (nftc > maxv) {
                        maxv = nftc;
                        maxi = i;
                    }
                } // now we've got the pitch numbers we need
                freev(coefs);
                p.v[j] = pow(2, log2pc + (maxi * POLYV));
            }
        }
        else 
#if 0
            p.v[j] = NAN;
#else
            p.v[j] = 0.0;
#endif
    }
    freev(ntc);
    freev(s);
    return(p);
}